

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Supp_One_t * Supp_ManMergeEntry(Supp_Man_t *pMan,Supp_One_t *p1,Supp_One_t *p2,int nRefs)

{
  Supp_One_t *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Supp_One_t *pSVar5;
  Supp_One_t *pSVar6;
  Supp_One_t *pSVar7;
  Supp_One_t *pSVar8;
  int iVar9;
  
  iVar9 = p2->nOuts + p1->nOuts;
  pSVar5 = (Supp_One_t *)Supp_ManFetch(pMan,iVar9 * 4 + 0xc);
  pSVar5->nRefs = nRefs;
  pSVar5->nOuts = 0;
  pSVar5->nOutsAlloc = iVar9;
  pSVar8 = p1 + 1;
  pSVar6 = p2 + 1;
  pSVar1 = pSVar5 + 1;
  iVar9 = p1->nOuts;
  iVar2 = p2->nOuts;
  pSVar7 = pSVar1;
  if (0 < iVar2 && 0 < (long)iVar9) {
    do {
      iVar3 = pSVar8->nRefs;
      iVar4 = pSVar6->nRefs;
      if (iVar3 == iVar4) {
        pSVar8 = (Supp_One_t *)&pSVar8->nOuts;
        pSVar7->nRefs = iVar3;
        pSVar6 = (Supp_One_t *)&pSVar6->nOuts;
      }
      else if (iVar3 < iVar4) {
        pSVar8 = (Supp_One_t *)&pSVar8->nOuts;
        pSVar7->nRefs = iVar3;
      }
      else {
        pSVar6 = (Supp_One_t *)&pSVar6->nOuts;
        pSVar7->nRefs = iVar4;
      }
      pSVar7 = (Supp_One_t *)&pSVar7->nOuts;
    } while ((pSVar8 < (Supp_One_t *)(&p1[1].nRefs + iVar9)) &&
            (pSVar6 < (Supp_One_t *)(&p2[1].nRefs + iVar2)));
  }
  for (; pSVar8 < (Supp_One_t *)(&p1[1].nRefs + iVar9); pSVar8 = (Supp_One_t *)&pSVar8->nOuts) {
    pSVar7->nRefs = pSVar8->nRefs;
    pSVar7 = (Supp_One_t *)&pSVar7->nOuts;
  }
  for (; pSVar6 < (Supp_One_t *)(&p2[1].nRefs + iVar2); pSVar6 = (Supp_One_t *)&pSVar6->nOuts) {
    pSVar7->nRefs = pSVar6->nRefs;
    pSVar7 = (Supp_One_t *)&pSVar7->nOuts;
  }
  iVar9 = (int)((ulong)((long)pSVar7 - (long)pSVar1) >> 2);
  pSVar5->nOuts = iVar9;
  if (pSVar5->nOutsAlloc < iVar9) {
    __assert_fail("p->nOuts <= p->nOutsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0xea,
                  "Supp_One_t *Supp_ManMergeEntry(Supp_Man_t *, Supp_One_t *, Supp_One_t *, int)");
  }
  if (iVar9 < p1->nOuts) {
    __assert_fail("p->nOuts >= p1->nOuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0xeb,
                  "Supp_One_t *Supp_ManMergeEntry(Supp_Man_t *, Supp_One_t *, Supp_One_t *, int)");
  }
  if (iVar9 < p2->nOuts) {
    __assert_fail("p->nOuts >= p2->nOuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0xec,
                  "Supp_One_t *Supp_ManMergeEntry(Supp_Man_t *, Supp_One_t *, Supp_One_t *, int)");
  }
  return pSVar5;
}

Assistant:

Supp_One_t * Supp_ManMergeEntry( Supp_Man_t * pMan, Supp_One_t * p1, Supp_One_t * p2, int nRefs )
{
    Supp_One_t * p = Supp_ManFetchEntry( pMan, p1->nOuts + p2->nOuts, nRefs );
    int * pBeg1 = p1->pOuts;
    int * pBeg2 = p2->pOuts;
    int * pBeg  = p->pOuts;
    int * pEnd1 = p1->pOuts + p1->nOuts;
    int * pEnd2 = p2->pOuts + p2->nOuts;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    p->nOuts = pBeg - p->pOuts;
    assert( p->nOuts <= p->nOutsAlloc );
    assert( p->nOuts >= p1->nOuts );
    assert( p->nOuts >= p2->nOuts );
    return p;
}